

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O3

void __thiscall spvtools::opt::IRContext::BuildDebugInfoManager(IRContext *this)

{
  byte *pbVar1;
  DebugInfoManager *__ptr;
  DebugInfoManager *this_00;
  
  this_00 = (DebugInfoManager *)operator_new(0x138);
  analysis::DebugInfoManager::DebugInfoManager(this_00,this);
  __ptr = (this->debug_info_mgr_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
          .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>._M_head_impl;
  (this->debug_info_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>._M_head_impl = this_00;
  if (__ptr != (DebugInfoManager *)0x0) {
    std::default_delete<spvtools::opt::analysis::DebugInfoManager>::operator()
              ((default_delete<spvtools::opt::analysis::DebugInfoManager> *)&this->debug_info_mgr_,
               __ptr);
  }
  pbVar1 = (byte *)((long)&this->valid_analyses_ + 2);
  *pbVar1 = *pbVar1 | 1;
  return;
}

Assistant:

void BuildDebugInfoManager() {
    debug_info_mgr_ = MakeUnique<analysis::DebugInfoManager>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisDebugInfo;
  }